

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

ImageChannelDesc * __thiscall
pbrt::Image::GetChannelDesc
          (ImageChannelDesc *__return_storage_ptr__,Image *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          requestedChannels)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  size_t sVar2;
  size_t __n;
  int iVar3;
  memory_resource *pmVar4;
  size_type n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_t sVar6;
  size_t sVar7;
  size_type *psVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
  *paVar9;
  ulong uVar10;
  bool bVar11;
  ImageChannelDesc desc;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_> local_60;
  
  n = requestedChannels.n;
  local_60.alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_60.ptr = (int *)0x0;
  local_60.nAlloc = 0;
  local_60.nStored = 0;
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::resize(&local_60,n);
  bVar11 = n != 0;
  if (bVar11) {
    pbVar1 = (this->channelNames).ptr;
    sVar2 = (this->channelNames).nStored;
    pbVar5 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &(this->channelNames).field_2;
    if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pbVar5 = pbVar1;
    }
    paVar9 = (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
              *)local_60.ptr;
    if ((anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)local_60.ptr ==
        (anon_union_16_1_a7e8d694_for_InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>_5
         *)0x0) {
      paVar9 = &local_60.field_2;
    }
    uVar10 = 0;
    do {
      if (sVar2 == 0) {
        sVar7 = 0;
      }
      else {
        __n = requestedChannels.ptr[uVar10]._M_string_length;
        sVar6 = 0;
        psVar8 = &pbVar5->_M_string_length;
        do {
          if ((__n == *psVar8) &&
             ((__n == 0 ||
              (iVar3 = bcmp(requestedChannels.ptr[uVar10]._M_dataplus._M_p,
                            (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (psVar8 + -1))->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
            paVar9->fixed[uVar10] = (int)sVar6;
            sVar7 = sVar6;
            break;
          }
          sVar6 = sVar6 + 1;
          psVar8 = psVar8 + 4;
          sVar7 = sVar2;
        } while (sVar2 != sVar6);
      }
      if (sVar7 == sVar2) {
        pmVar4 = pstd::pmr::new_delete_resource();
        (__return_storage_ptr__->offset).alloc.memoryResource = pmVar4;
        (__return_storage_ptr__->offset).ptr = (int *)0x0;
        (__return_storage_ptr__->offset).nAlloc = 0;
        (__return_storage_ptr__->offset).nStored = 0;
        if (bVar11) goto LAB_0045bc4b;
        break;
      }
      uVar10 = uVar10 + 1;
      bVar11 = uVar10 < n;
    } while (uVar10 != n);
  }
  InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::InlinedVector
            (&__return_storage_ptr__->offset,&local_60);
LAB_0045bc4b:
  local_60.nStored = 0;
  (*(local_60.alloc.memoryResource)->_vptr_memory_resource[3])
            (local_60.alloc.memoryResource,local_60.ptr,local_60.nAlloc << 2,4);
  return __return_storage_ptr__;
}

Assistant:

ImageChannelDesc Image::GetChannelDesc(
    pstd::span<const std::string> requestedChannels) const {
    ImageChannelDesc desc;
    desc.offset.resize(requestedChannels.size());
    for (size_t i = 0; i < requestedChannels.size(); ++i) {
        size_t j;
        for (j = 0; j < channelNames.size(); ++j)
            if (requestedChannels[i] == channelNames[j]) {
                desc.offset[i] = j;
                break;
            }
        if (j == channelNames.size())
            return {};
    }

    return desc;
}